

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_validate(maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *context,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
           json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *param_6)

{
  undefined1 *puVar1;
  bool bVar2;
  semantic_tag sVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  walk_result wVar10;
  double dVar11;
  double dVar12;
  string_view_type sVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  bigint n1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  this_context;
  validation_message local_148;
  
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  eval_context(&this_context,context,
               &(this->
                super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ).
                super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                .keyword_name_);
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64(instance);
  if (bVar2) {
    puVar1 = &(this->
              super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ).field_0xe0;
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)puVar1);
    if (!bVar2) goto LAB_003d3d03;
    lVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
                      (instance);
    lVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)puVar1);
    if (lVar7 < lVar6) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                (&val,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n1,
                     &this->message_,&val);
      (*(this->
        super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ).
        super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        .super_validation_message_factory._vptr_validation_message_factory[2])
                (&local_148,this,&this_context.eval_path_,instance_location,&n1);
      reporter->error_count_ = reporter->error_count_ + 1;
      iVar4 = (*reporter->_vptr_error_reporter[2])(reporter,&local_148);
LAB_003d3f2c:
      validation_message::~validation_message(&local_148);
      std::__cxx11::string::~string((string *)&n1);
      std::__cxx11::string::~string((string *)&val);
      if (iVar4 == 1) {
        wVar10 = abort;
        goto LAB_003d3f7d;
      }
    }
  }
  else {
LAB_003d3d03:
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64(instance);
    if (bVar2) {
      puVar1 = &(this->
                super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ).field_0xe0;
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)puVar1)
      ;
      if (bVar2) {
        uVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                as_integer<unsigned_long>(instance);
        uVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                as_integer<unsigned_long>
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           puVar1);
        if (uVar9 < uVar8) {
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          as_string<std::allocator<char>>
                    (&val,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n1,
                         &this->message_,&val);
          (*(this->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[2])
                    (&local_148,this,&this_context.eval_path_,instance_location,&n1);
          reporter->error_count_ = reporter->error_count_ + 1;
          iVar4 = (*reporter->_vptr_error_reporter[2])(reporter,&local_148);
          goto LAB_003d3f2c;
        }
        goto LAB_003d3f7b;
      }
    }
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(instance);
    if (bVar2) {
      sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag(instance);
      if (sVar3 == bigint) {
        sVar13 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           (instance);
        basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
                  (&n1,sVar13._M_str,sVar13._M_len);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>
                  (&s2,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                       &(this->
                        super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        ).field_0xe0);
        basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
                  ((basic_bigint<std::allocator<unsigned_char>_> *)&val,s2._M_dataplus._M_p,
                   s2._M_string_length);
        bVar2 = operator>(&n1,(basic_bigint<std::allocator<unsigned_char>_> *)&val);
        if (bVar2) {
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          as_string<std::allocator<char>>
                    (&val_2,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                            instance);
          std::operator+(&local_1a0,&this->message_,&val_2);
          (*(this->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[2])
                    (&local_148,this,&this_context.eval_path_,instance_location,&local_1a0);
          reporter->error_count_ = reporter->error_count_ + 1;
          uVar5 = (*reporter->_vptr_error_reporter[2])(reporter,&local_148);
          reporter = (error_reporter *)(ulong)uVar5;
          validation_message::~validation_message(&local_148);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&val_2);
          bVar2 = uVar5 != 1;
        }
        else {
          bVar2 = true;
        }
        wVar10 = (walk_result)reporter;
        basic_bigint<std::allocator<unsigned_char>_>::destroy
                  ((basic_bigint<std::allocator<unsigned_char>_> *)&val);
        std::__cxx11::string::~string((string *)&s2);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&n1);
        if (!bVar2) goto LAB_003d3f7d;
        goto LAB_003d3f7b;
      }
    }
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(instance);
    if (bVar2) {
      dVar11 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double(instance)
      ;
      dVar12 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          &(this->
                           super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           ).field_0xe0);
      if (dVar12 < dVar11) {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>
                  (&val,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n1,
                       &this->message_,&val);
        (*(this->
          super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ).
          super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          .super_validation_message_factory._vptr_validation_message_factory[2])
                  (&local_148,this,&this_context.eval_path_,instance_location,&n1);
        reporter->error_count_ = reporter->error_count_ + 1;
        iVar4 = (*reporter->_vptr_error_reporter[2])(reporter,&local_148);
        goto LAB_003d3f2c;
      }
    }
  }
LAB_003d3f7b:
  wVar10 = advance;
LAB_003d3f7d:
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  ~eval_context(&this_context);
  return wVar10;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter, 
            Json& /*patch*/) const final 
        {
            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.is_int64() && value_.is_int64())
            {
                if (instance.template as<int64_t>() > value_.template as<int64_t>())
                {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_uint64() && value_.is_uint64())
            {
                if (instance.template as<uint64_t>() > value_.template as<uint64_t>())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_string_view() && instance.tag() == semantic_tag::bigint)
            {
                auto sv1 = instance.as_string_view();
                bigint n1 = bigint::from_string(sv1.data(), sv1.length());
                auto s2 = value_.as_string();
                bigint n2 = bigint::from_string(s2.data(), s2.length());
                if (n1 > n2)
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_number())
            {
                if (instance.template as<double>() > value_.template as<double>())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            return walk_result::advance;
        }